

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::RepeatedField<double>::RemoveLast(RepeatedField<double> *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *__src;
  LongSooRep *pLVar8;
  LongSooRep *this_00;
  bool bVar9;
  LongSooRep LStack_68;
  RepeatedField<double> *pRStack_58;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  uVar3 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  pLVar8 = (LongSooRep *)(ulong)uVar3;
  if (0 < (int)uVar3) {
    bVar9 = (uVar1 & 4) == 0;
    elements(this,bVar9);
    iVar4 = internal::SooRep::size(&this->soo_rep_,bVar9);
    if ((iVar4 != uVar3 - 1) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,uVar3 - 1);
    return;
  }
  RemoveLast();
  uVar1 = pLVar8->elements_int;
  pRStack_58 = this;
  uVar3 = internal::SooRep::size((SooRep *)pLVar8,(uVar1 & 4) == 0);
  this_00 = (LongSooRep *)(ulong)uVar3;
  if (0 < (int)uVar3) {
    bVar9 = (uVar1 & 4) == 0;
    RepeatedField<bool>::elements((RepeatedField<bool> *)pLVar8,bVar9);
    iVar4 = internal::SooRep::size((SooRep *)pLVar8,bVar9);
    if ((iVar4 != uVar3 - 1) && ((pLVar8->elements_int & 4) != 0)) {
      internal::LongSooRep::elements(pLVar8);
    }
    RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar8,(uVar1 & 4) == 0,uVar3 - 1);
    return;
  }
  pLVar8 = &LStack_68;
  RepeatedField<bool>::RemoveLast();
  if (pLVar8 == this_00) {
    RepeatedField<int>::MergeFrom();
  }
  uVar1 = pLVar8->elements_int;
  iVar4 = internal::SooRep::size((SooRep *)pLVar8,(uVar1 & 4) == 0);
  if (iVar4 != 0) {
    iVar5 = internal::SooRep::size((SooRep *)this_00,(this_00->elements_int & 4) == 0);
    iVar5 = iVar5 + iVar4;
    RepeatedField<int>::Reserve((RepeatedField<int> *)this_00,iVar5);
    uVar2 = this_00->elements_int;
    bVar9 = (uVar2 & 4) == 0;
    piVar7 = RepeatedField<int>::elements((RepeatedField<int> *)this_00,bVar9);
    iVar6 = internal::SooRep::size((SooRep *)this_00,bVar9);
    if ((iVar6 != iVar5) && ((this_00->elements_int & 4) != 0)) {
      internal::LongSooRep::elements(this_00);
    }
    RepeatedField<int>::set_size((RepeatedField<int> *)this_00,(uVar2 & 4) == 0,iVar5);
    __src = RepeatedField<int>::elements((RepeatedField<int> *)pLVar8,(uVar1 & 4) == 0);
    memcpy(piVar7 + iVar6,__src,(long)iVar4 << 2);
    return;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}